

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::warn<char[33]>(ConsoleLogger *this,char (*args) [33])

{
  ConsoleLogger *in_RSI;
  char (*in_RDI) [33];
  
  if (*(int *)(in_RDI[3] + 9) < 3) {
    std::mutex::lock((mutex *)in_RSI);
    if ((in_RDI[3][5] & 1U) != 0) {
      std::operator<<(*(ostream **)*in_RDI,(string *)(in_RDI[1] + 7));
    }
    std::operator<<(*(ostream **)*in_RDI,"[!] ");
    print<char[33]>(in_RSI,in_RDI);
    if ((in_RDI[3][5] & 1U) != 0) {
      std::operator<<(*(ostream **)*in_RDI,"\x1b[0m");
    }
    std::mutex::unlock((mutex *)0x1942c7);
  }
  return;
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}